

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O2

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::ReleaseSecondary
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,SecondaryAllocation *allocation,
          void *segmentParam)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_00;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *list;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pageSegment;
  undefined8 *in_FS_OFFSET;
  
  if (allocation->address == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xad0,"(allocation.address != nullptr)","allocation.address != nullptr");
    if (!bVar3) goto LAB_00277394;
    *puVar1 = 0;
  }
  if (*(long *)((long)segmentParam + 8) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xad1,"(segment->GetSecondaryAllocator())",
                       "segment->GetSecondaryAllocator()");
    if (!bVar3) goto LAB_00277394;
    *puVar1 = 0;
  }
  if ((ulong)(this->
             super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
             ).maxAllocPageCount <
      *(long *)((long)segmentParam + 0x18) - (ulong)*(uint *)((long)segmentParam + 0x28)) {
    bVar3 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                      ((SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xae9,"(segment->CanAllocSecondary())","segment->CanAllocSecondary()");
      if (!bVar3) {
LAB_00277394:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    (**(code **)(**(long **)((long)segmentParam + 8) + 8))
              (*(long **)((long)segmentParam + 8),allocation);
  }
  else {
    this_00 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::GetSegmentList(&this->
                                super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                               ,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    (**(code **)(**(long **)((long)segmentParam + 8) + 8))
              (*(long **)((long)segmentParam + 8),allocation);
    list = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           ::GetSegmentList(&this->
                             super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                            ,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    if (this_00 != list) {
      Output::Trace(EmitterPhase,L"XDATA reclaimed pages:%u\n",
                    (ulong)*(uint *)((long)segmentParam + 0x80));
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::MoveElementTo
                (this_00,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,list);
      if (this_00 !=
          &(this->
           super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           ).fullSegments) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0xae1,"(fromList == &this->fullSegments)",
                           "Releasing a secondary allocator should make a state change only if the segment was originally in the full list"
                          );
        if (!bVar3) goto LAB_00277394;
        *puVar1 = 0;
      }
      bVar3 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                        ((SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0xae2,"(pageSegment->CanAllocSecondary())",
                           "It should be allocate secondary now");
        if (!bVar3) goto LAB_00277394;
        *puVar1 = 0;
      }
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::AddFreePageCount(&this->
                          super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                         ,*(uint *)((long)segmentParam + 0x80));
      return true;
    }
  }
  return false;
}

Assistant:

bool HeapPageAllocator<T>::ReleaseSecondary(const SecondaryAllocation& allocation, void* segmentParam)
{
    SegmentBase<T> * segment = (SegmentBase<T>*)segmentParam;
    Assert(allocation.address != nullptr);
    Assert(segment->GetSecondaryAllocator());

    if (this->IsPageSegment(segment))
    {
        PageSegmentBase<T>* pageSegment = static_cast<PageSegmentBase<T>*>(segment);
        auto fromList = this->GetSegmentList(pageSegment);

        pageSegment->GetSecondaryAllocator()->Release(allocation);

        auto toList = this->GetSegmentList(pageSegment);

        if (fromList != toList)
        {
            OUTPUT_TRACE(Js::EmitterPhase, _u("XDATA reclaimed pages:%u\n"), pageSegment->GetFreePageCount());
            fromList->MoveElementTo(pageSegment, toList);

            AssertMsg(fromList == &this->fullSegments, "Releasing a secondary allocator should make a state change only if the segment was originally in the full list");
            AssertMsg(pageSegment->CanAllocSecondary(), "It should be allocate secondary now");
            this->AddFreePageCount(pageSegment->GetFreePageCount());
            return true;
        }
    }
    else
    {
        Assert(segment->CanAllocSecondary());
        segment->GetSecondaryAllocator()->Release(allocation);
    }
    return false;
}